

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O0

int main(void)

{
  int **ppiVar1;
  int **ppiVar2;
  int iVar3;
  size_type sVar4;
  int local_5c;
  int *local_58;
  int local_50 [2];
  size_type local_48;
  int **local_40;
  int *dptr;
  int data;
  int local_24;
  size_type local_20;
  bool local_12;
  bool local_11;
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
  local_10;
  undefined4 local_c;
  layout_mapping_left<dimensions<>,_dimensions<>,_dimensions<>_> l;
  
  local_c = 0;
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
  ::layout_mapping_regular_precomputed_strides(&local_10);
  local_11 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
             ::is_regular();
  local_12 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x161,"int main()",&local_11,&local_12);
  local_20 = std::experimental::dimensions<>::size((dimensions<> *)&local_10);
  local_24 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.size())","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x163,"int main()",&local_20,&local_24);
  _data = std::experimental::detail::
          layout_mapping_regular_base<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
          ::span(&local_10.
                  super_layout_mapping_regular_base<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
                );
  dptr._4_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.span())","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x164,"int main()",(unsigned_long *)&data,(int *)((long)&dptr + 4));
  dptr._0_4_ = 0x2a;
  local_40 = &dptr;
  local_48 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
             ::index<>(&local_10);
  local_50[1] = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.index())","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x169,"int main()",&local_48,local_50 + 1);
  ppiVar1 = local_40;
  sVar4 = std::experimental::
          layout_mapping_regular_precomputed_strides<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
          ::index<>(&local_10);
  local_50[0] = 0x2a;
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index()])","42",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x16b,"int main()",(int *)((long)ppiVar1 + sVar4 * 4),local_50);
  ppiVar1 = local_40;
  sVar4 = std::experimental::
          layout_mapping_regular_precomputed_strides<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
          ::index<>(&local_10);
  local_58 = (int *)((long)ppiVar1 + sVar4 * 4);
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[l.index()])","dptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x16d,"int main()",&local_58,(int **)&local_40);
  ppiVar1 = local_40;
  sVar4 = std::experimental::
          layout_mapping_regular_precomputed_strides<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
          ::index<>(&local_10);
  ppiVar2 = local_40;
  *(undefined4 *)((long)ppiVar1 + sVar4 * 4) = 0x11;
  sVar4 = std::experimental::
          layout_mapping_regular_precomputed_strides<std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::dimensions<>,_std::experimental::detail::integer_sequence<unsigned_long>_>
          ::index<>(&local_10);
  local_5c = 0x11;
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index()])","17",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x171,"int main()",(int *)((long)ppiVar2 + sVar4 * 4),&local_5c);
  test_1d_static<1ul>();
  test_1d_static<30ul>();
  test_1d_dynamic<1ul>();
  test_1d_dynamic<30ul>();
  test_2d_static<1ul,1ul>();
  test_2d_static<30ul,1ul>();
  test_2d_static<1ul,30ul>();
  test_2d_static<30ul,15ul>();
  test_2d_static<15ul,30ul>();
  test_2d_static<30ul,30ul>();
  test_2d_dynamic<1ul,1ul>();
  test_2d_dynamic<30ul,1ul>();
  test_2d_dynamic<1ul,30ul>();
  test_2d_dynamic<30ul,15ul>();
  test_2d_dynamic<15ul,30ul>();
  test_2d_dynamic<30ul,30ul>();
  test_2d_mixed_SD<1ul,1ul>();
  test_2d_mixed_SD<30ul,1ul>();
  test_2d_mixed_SD<1ul,30ul>();
  test_2d_mixed_SD<30ul,15ul>();
  test_2d_mixed_SD<15ul,30ul>();
  test_2d_mixed_SD<30ul,30ul>();
  test_2d_mixed_SD<1ul,1ul>();
  test_2d_mixed_SD<30ul,1ul>();
  test_2d_mixed_SD<1ul,30ul>();
  test_2d_mixed_SD<30ul,15ul>();
  test_2d_mixed_SD<15ul,30ul>();
  test_2d_mixed_SD<30ul,30ul>();
  test_3d_static<1ul,1ul,1ul>();
  test_3d_static<30ul,1ul,1ul>();
  test_3d_static<1ul,30ul,1ul>();
  test_3d_static<1ul,1ul,30ul>();
  test_3d_static<1ul,30ul,30ul>();
  test_3d_static<30ul,1ul,30ul>();
  test_3d_static<30ul,30ul,1ul>();
  test_3d_static<30ul,15ul,15ul>();
  test_3d_static<15ul,30ul,15ul>();
  test_3d_static<15ul,15ul,30ul>();
  test_3d_static<15ul,30ul,30ul>();
  test_3d_static<30ul,15ul,30ul>();
  test_3d_static<30ul,30ul,15ul>();
  test_3d_static<30ul,30ul,30ul>();
  test_3d_dynamic<1ul,1ul,1ul>();
  test_3d_dynamic<30ul,1ul,1ul>();
  test_3d_dynamic<1ul,30ul,1ul>();
  test_3d_dynamic<1ul,1ul,30ul>();
  test_3d_dynamic<1ul,30ul,30ul>();
  test_3d_dynamic<30ul,1ul,30ul>();
  test_3d_dynamic<30ul,30ul,1ul>();
  test_3d_dynamic<30ul,15ul,15ul>();
  test_3d_dynamic<15ul,30ul,15ul>();
  test_3d_dynamic<15ul,15ul,30ul>();
  test_3d_dynamic<15ul,30ul,30ul>();
  test_3d_dynamic<30ul,15ul,30ul>();
  test_3d_dynamic<30ul,30ul,15ul>();
  test_3d_dynamic<30ul,30ul,30ul>();
  iVar3 = boost::report_errors();
  return iVar3;
}

Assistant:

int main()
{
    // Empty
    {
        layout_mapping_left<dimensions<>, dimensions<>, dimensions<> > const l{};

        BOOST_TEST_EQ((l.is_regular()), true);

        BOOST_TEST_EQ((l.size()), 1);
        BOOST_TEST_EQ((l.span()), 1);

        int data = 42;
        int* dptr = &data;

        BOOST_TEST_EQ((l.index()), 0);

        BOOST_TEST_EQ((dptr[l.index()]), 42); 

        BOOST_TEST_EQ(&(dptr[l.index()]), dptr); 

        dptr[l.index()] = 17;

        BOOST_TEST_EQ((dptr[l.index()]), 17); 
    }

    // 1D Static
    test_1d_static<1 >();
    test_1d_static<30>();

    // 1D Dynamic
    test_1d_dynamic<1 >();
    test_1d_dynamic<30>();

    // 2D Static
    test_2d_static<1,  1 >();

    test_2d_static<30, 1 >();
    test_2d_static<1,  30>();

    test_2d_static<30, 15>();
    test_2d_static<15, 30>();

    test_2d_static<30, 30>();

    // 2D Dynamic
    test_2d_dynamic<1,  1 >();

    test_2d_dynamic<30, 1 >();
    test_2d_dynamic<1,  30>();

    test_2d_dynamic<30, 15>();
    test_2d_dynamic<15, 30>();

    test_2d_dynamic<30, 30>();

    // 2D Mixed - A[dynamic][static]
    test_2d_mixed_SD<1,  1 >();

    test_2d_mixed_SD<30, 1 >();
    test_2d_mixed_SD<1,  30>();

    test_2d_mixed_SD<30, 15>();
    test_2d_mixed_SD<15, 30>();

    test_2d_mixed_SD<30, 30>();

    // 2D Mixed - A[static][dynamic]
    test_2d_mixed_SD<1,  1 >();

    test_2d_mixed_SD<30, 1 >();
    test_2d_mixed_SD<1,  30>();

    test_2d_mixed_SD<30, 15>();
    test_2d_mixed_SD<15, 30>();

    test_2d_mixed_SD<30, 30>();

    // 3D Static
    test_3d_static<1,  1,  1 >();

    test_3d_static<30, 1,  1 >();
    test_3d_static<1,  30, 1 >();
    test_3d_static<1,  1,  30>();

    test_3d_static<1,  30, 30>();
    test_3d_static<30, 1,  30>();
    test_3d_static<30, 30, 1 >();

    test_3d_static<30, 15, 15>();
    test_3d_static<15, 30, 15>();
    test_3d_static<15, 15, 30>();

    test_3d_static<15, 30, 30>();
    test_3d_static<30, 15, 30>();
    test_3d_static<30, 30, 15>();

    test_3d_static<30, 30, 30>();

    // 3D Dynamic
    test_3d_dynamic<1,  1,  1 >();

    test_3d_dynamic<30, 1,  1 >();
    test_3d_dynamic<1,  30, 1 >();
    test_3d_dynamic<1,  1,  30>();

    test_3d_dynamic<1,  30, 30>();
    test_3d_dynamic<30, 1,  30>();
    test_3d_dynamic<30, 30, 1 >();

    test_3d_dynamic<30, 15, 15>();
    test_3d_dynamic<15, 30, 15>();
    test_3d_dynamic<15, 15, 30>();

    test_3d_dynamic<15, 30, 30>();
    test_3d_dynamic<30, 15, 30>();
    test_3d_dynamic<30, 30, 15>();

    test_3d_dynamic<30, 30, 30>();

    return boost::report_errors();
}